

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

int helics::apps::addUsedPotentialInterfaceToCommand
              (json *potentialCommand,
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
              *potentials,string *possibleFed,int logLevel,string *type,Federate *fed)

{
  initializer_list_t init;
  string_view message;
  format_args args;
  string_view fmt;
  bool bVar1;
  back_insert_iterator<std::vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>_>
  __str;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  int in_ECX;
  undefined8 in_RDX;
  Federate *in_RDI;
  undefined8 in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *iface;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *__range3;
  vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  enabledInterfaces;
  int interfaceCount;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  back_insert_iterator<std::vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>_>
  in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  in_stack_fffffffffffffd90;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  in_stack_fffffffffffffd98;
  Federate *this;
  Federate *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdd8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffde0;
  key_type *in_stack_fffffffffffffde8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffdf0;
  __node_type local_1e9;
  reference local_198;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *local_190;
  __normal_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_*,_std::vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>_>
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_158 [2];
  vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *local_138;
  vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *local_100;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  local_f8;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined8 local_c0;
  int local_b4;
  undefined8 local_b0;
  Federate *local_a0;
  char local_98 [48];
  undefined8 local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  reference local_40;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  unsigned_long_long uVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  
  local_e8.field_2._12_4_ = 0;
  this_01 = &local_e8;
  local_c8 = in_R9;
  local_c0 = in_R8;
  local_b4 = in_ECX;
  local_b0 = in_RDX;
  local_a0 = in_RDI;
  CLI::std::
  vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  ::vector((vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
            *)0x42f9e3);
  local_f0._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       ::begin((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_f8._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
              *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_100 = (vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
               *)std::
                 back_inserter<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>>>
                           ((vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::__cxx11::string::string(this_01,in_stack_fffffffffffffdb8);
  __str = std::
          copy_if<std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,false,true>,std::back_insert_iterator<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>>>,helics::apps::addUsedPotentialInterfaceToCommand(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&,std::unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::apps::PotentialConnections,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>>const&,std::__cxx11::string_const&,int,std::__cxx11::string_const&,helics::Federate*)::__0>
                    ((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
                      )in_stack_fffffffffffffd98._M_cur,
                     (_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
                      )in_stack_fffffffffffffd90._M_cur,in_stack_fffffffffffffd88,
                     (anon_class_32_1_c62652b4 *)in_stack_fffffffffffffd80);
  local_138 = (vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
               *)__str;
  addUsedPotentialInterfaceToCommand(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&,std::unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::apps::PotentialConnections,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>>const&,std::__cxx11::string_const&,int,std::__cxx11::string_const&,helics::Federate*)
  ::$_0::~__0((anon_class_32_1_c62652b4 *)0x42fa88);
  bVar1 = CLI::std::
          vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
          ::empty((vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                   *)in_stack_fffffffffffffd90._M_cur);
  if (!bVar1) {
    std::
    initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
    ::initializer_list(local_158);
    init._M_len = (size_type)in_stack_fffffffffffffd98._M_cur;
    init._M_array = (iterator)in_stack_fffffffffffffd90._M_cur;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::array(init);
    this_00 = local_a0;
    std::__cxx11::string::string
              (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __str.container);
    pvVar2 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffd90._M_cur,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffd88.container);
    std::__cxx11::string::~string(in_stack_fffffffffffffd80);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffd80);
    local_180 = &local_e8;
    local_188._M_current =
         (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
          *)CLI::std::
            vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
            ::begin((vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_190 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
                 *)CLI::std::
                   vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                   ::end((vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_*,_std::vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>_>
                             ((__normal_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_*,_std::vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>_>
                               *)in_stack_fffffffffffffd80,
                              (__normal_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_*,_std::vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_198 = __gnu_cxx::
                  __normal_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_*,_std::vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>_>
                  ::operator*(&local_188);
      this = local_a0;
      std::__cxx11::string::string
                (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __str.container);
      val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator[](in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &(local_198->second).key;
      in_stack_fffffffffffffd90._M_cur = &local_1e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (this_01,(basic_string_view<char,_std::char_traits<char>_> *)__str.container,
                 (allocator<char> *)this_00);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)this,val);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(in_stack_fffffffffffffd80);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      std::__cxx11::string::~string(in_stack_fffffffffffffd80);
      local_e8.field_2._12_4_ = local_e8.field_2._12_4_ + 1;
      if (8 < local_b4) {
        in_stack_fffffffffffffdd8 =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)0x19;
        aVar4.values_ = (value<fmt::v11::context> *)&stack0xfffffffffffffde0;
        local_28 = "federate {} request {} {}";
        uVar3 = 0x19;
        local_30 = local_b0;
        local_38 = local_c0;
        local_40 = local_198;
        local_58 = "federate {} request {} {}";
        uStack_50 = 0x19;
        in_stack_fffffffffffffd80 = local_c8;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffffd90._M_cur,x);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffffd90._M_cur,x);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffffd90._M_cur,
                   (basic_string_view<char,_std::char_traits<char>_> *)x);
        local_60 = local_98;
        local_68 = 0xddd;
        fmt.size_ = (size_t)&local_68;
        fmt.data_ = local_60;
        args.field_1.values_ = aVar4.values_;
        args.desc_ = uVar3;
        ::fmt::v11::vformat_abi_cxx11_(fmt,args);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd80);
        message._M_str = (char *)this_01;
        message._M_len = (size_t)__str.container;
        Federate::logMessage(this_00,(int)((ulong)pvVar2 >> 0x20),message);
        std::__cxx11::string::~string(in_stack_fffffffffffffd80);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_*,_std::vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>_>
      ::operator++(&local_188);
    }
  }
  CLI::std::
  vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  ::~vector((vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
             *)in_stack_fffffffffffffd90._M_cur);
  return local_e8.field_2._12_4_;
}

Assistant:

static int addUsedPotentialInterfaceToCommand(
    nlohmann::json& potentialCommand,
    const std::unordered_map<std::string_view, PotentialConnections>& potentials,
    const std::string& possibleFed,
    int logLevel,
    const std::string& type,
    Federate* fed)
{
    int interfaceCount{0};
    std::vector<std::remove_cv_t<std::remove_reference_t<decltype(*potentials.begin())>>>
        enabledInterfaces;
    std::copy_if(potentials.begin(),
                 potentials.end(),
                 std::back_inserter(enabledInterfaces),
                 [possibleFed](auto& pInterface) {
                     return (pInterface.second.federate == possibleFed &&
                             pInterface.second.used == true);
                 });
    if (!enabledInterfaces.empty()) {
        potentialCommand[type] = nlohmann::json::array();
        for (const auto& iface : enabledInterfaces) {
            potentialCommand[type].push_back(std::string(iface.second.key));
            ++interfaceCount;
            if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
                fed->logMessage(
                    HELICS_LOG_LEVEL_CONNECTIONS,
                    fmt::format("federate {} request {} {}", possibleFed, type, iface.first));
            }
        }
    }
    return interfaceCount;
}